

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

void cl_reset_reader(Curl_easy *data)

{
  Curl_creader *pCVar1;
  
  while (pCVar1 = (data->req).reader_stack, pCVar1 != (Curl_creader *)0x0) {
    (data->req).reader_stack = pCVar1->next;
    (*pCVar1->crt->do_close)(data,pCVar1);
    (*Curl_cfree)(pCVar1);
  }
  return;
}

Assistant:

static void cl_reset_reader(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  while(reader) {
    data->req.reader_stack = reader->next;
    reader->crt->do_close(data, reader);
    free(reader);
    reader = data->req.reader_stack;
  }
}